

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  uint uVar1;
  ImDrawList *pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ImVec4 *col;
  ImGuiTabItem *tab_00;
  char *local_198;
  char local_181;
  ImGuiTabItem *tab;
  int tab_n;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImDrawList *local_138;
  ImDrawList *draw_list;
  bool open;
  char *pcStack_128;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [256];
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  buf_end = (char *)&p;
  pcStack_128 = buf + 0xf8;
  iVar5 = tab_bar->PrevFrameVisible;
  buf._248_8_ = label;
  iVar4 = GetFrameCount();
  draw_list._7_1_ = iVar4 + -2 <= iVar5;
  pcVar6 = " *Inactive*";
  if ((bool)draw_list._7_1_) {
    pcVar6 = "";
  }
  iVar5 = ImFormatString(buf_end,(long)pcStack_128 - (long)buf_end,"%s 0x%08X (%d tabs)%s",
                         buf._248_8_,(ulong)tab_bar->ID,(ulong)(uint)(tab_bar->Tabs).Size,pcVar6);
  buf_end = buf_end + iVar5;
  if ((draw_list._7_1_ & 1) == 0) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  draw_list._6_1_ = TreeNode(tab_bar,"%s",&p);
  if ((draw_list._7_1_ & 1) == 0) {
    PopStyleColor(1);
  }
  if (((draw_list._7_1_ & 1) != 0) && (bVar3 = IsItemHovered(0), bVar3)) {
    local_138 = GetForegroundDrawList();
    ImDrawList::AddRect(local_138,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0xf
                        ,1.0);
    pIVar2 = local_138;
    ImVec2::ImVec2(&local_140,tab_bar->ScrollingRectMinX,(tab_bar->BarRect).Min.y);
    ImVec2::ImVec2(&local_148,tab_bar->ScrollingRectMinX,(tab_bar->BarRect).Max.y);
    ImDrawList::AddLine(pIVar2,&local_140,&local_148,0xff00ff00,1.0);
    pIVar2 = local_138;
    ImVec2::ImVec2(&local_150,tab_bar->ScrollingRectMaxX,(tab_bar->BarRect).Min.y);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea8,tab_bar->ScrollingRectMaxX,
                   (tab_bar->BarRect).Max.y);
    ImDrawList::AddLine(pIVar2,&local_150,(ImVec2 *)&stack0xfffffffffffffea8,0xff00ff00,1.0);
  }
  if ((draw_list._6_1_ & 1) != 0) {
    for (tab._4_4_ = 0; (int)tab._4_4_ < (tab_bar->Tabs).Size; tab._4_4_ = tab._4_4_ + 1) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
      PushID(tab_00);
      bVar3 = SmallButton("<");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,tab_00,-1);
      }
      SameLine(0.0,2.0);
      bVar3 = SmallButton(">");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,tab_00,1);
      }
      SameLine(0.0,-1.0);
      local_181 = '*';
      if (tab_00->ID != tab_bar->SelectedTabId) {
        local_181 = ' ';
      }
      uVar1 = tab_00->ID;
      if (tab_00->NameOffset == -1) {
        local_198 = "";
      }
      else {
        local_198 = ImGuiTabBar::GetTabName(tab_bar,tab_00);
      }
      Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",(double)tab_00->Offset,
           (double)tab_00->Width,(double)tab_00->ContentWidth,(ulong)tab._4_4_,
           (ulong)(uint)(int)local_181,(ulong)uVar1,local_198);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(tab_bar, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}